

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O3

int acmod_advance(acmod_t *acmod)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = acmod->feat_outidx + 1;
  iVar3 = 0;
  if (iVar2 != acmod->n_feat_alloc) {
    iVar3 = iVar2;
  }
  acmod->feat_outidx = iVar3;
  acmod->n_feat_frame = acmod->n_feat_frame + -1;
  piVar1 = &acmod->mgau->frame_idx;
  *piVar1 = *piVar1 + 1;
  iVar3 = acmod->output_frame + 1;
  acmod->output_frame = iVar3;
  return iVar3;
}

Assistant:

int
acmod_advance(acmod_t *acmod)
{
    /* Advance the output pointers. */
    if (++acmod->feat_outidx == acmod->n_feat_alloc)
        acmod->feat_outidx = 0;
    --acmod->n_feat_frame;
    ++acmod->mgau->frame_idx;

    return ++acmod->output_frame;
}